

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O0

void ini_section_name_set(ini_t *ini,int section,char *name,int length)

{
  char *pcVar1;
  int local_24;
  int length_local;
  char *name_local;
  int section_local;
  ini_t *ini_local;
  
  if ((((ini != (ini_t *)0x0) && (name != (char *)0x0)) && (-1 < section)) &&
     (section < ini->section_count)) {
    local_24 = length;
    if (length < 1) {
      local_24 = sx_strlen(name);
    }
    if (ini->sections[section].name_large != (char *)0x0) {
      sx__free((sx_alloc *)ini->memctx,ini->sections[section].name_large,0,(char *)0x0,(char *)0x0,0
              );
    }
    ini->sections[section].name_large = (char *)0x0;
    if (local_24 + 1U < 0x20) {
      memcpy(ini->sections + section,name,(long)local_24);
      ini->sections[section].name[local_24] = '\0';
    }
    else {
      pcVar1 = (char *)sx__malloc((sx_alloc *)ini->memctx,(long)local_24 + 1,0,(char *)0x0,
                                  (char *)0x0,0);
      ini->sections[section].name_large = pcVar1;
      memcpy(ini->sections[section].name_large,name,(long)local_24);
      ini->sections[section].name_large[local_24] = '\0';
    }
  }
  return;
}

Assistant:

void ini_section_name_set( ini_t* ini, int section, char const* name, int length )
    {
    if( ini && name && section >= 0 && section < ini->section_count )
        {
        if( length <= 0 ) length = (int) INI_STRLEN( name );
        if( ini->sections[ section ].name_large ) INI_FREE( ini->memctx, ini->sections[ section ].name_large );
        ini->sections[ section ].name_large = 0;
        
        if( length + 1 >= sizeof( ini->sections[ 0 ].name ) )
            {
            ini->sections[ section ].name_large = (char*) INI_MALLOC( ini->memctx, (size_t) length + 1 );
            INI_MEMCPY( ini->sections[ section ].name_large, name, (size_t) length );
            ini->sections[ section ].name_large[ length ] = '\0';
            }
        else
            {
            INI_MEMCPY( ini->sections[ section ].name, name, (size_t) length );
            ini->sections[ section ].name[ length ] = '\0';
            }
        }
    }